

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::microfacet::pdf(microfacet *this,vec3 *wi,vec3 *wo,void *user_args)

{
  long lVar1;
  args *paVar2;
  byte bVar3;
  float fVar4;
  float_t fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vec3 vVar6;
  float_t nrm;
  undefined1 local_88 [24];
  vec3 local_70;
  args args;
  
  bVar3 = 0;
  vVar6 = operator+(wi,wo);
  local_70.z = vVar6.z;
  nrm = local_70.z * local_70.z + vVar6.x * vVar6.x + vVar6.y * vVar6.y;
  local_88._0_4_ = 0.0;
  if (0.0 < nrm) {
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = vVar6._0_8_;
    local_88._12_4_ = extraout_XMM0_Dd;
    if (user_args == (void *)0x0) {
      microfacet::args::standard();
    }
    else {
      paVar2 = &args;
      for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
        (paVar2->mtra).r[0].x = *user_args;
        user_args = (float_t *)((long)user_args + ((ulong)bVar3 * -2 + 1) * 4);
        paVar2 = (args *)((long)paVar2 + (ulong)bVar3 * -8 + 4);
      }
    }
    fVar4 = inversesqrt<float>(&nrm);
    local_70.z = local_70.z * fVar4;
    local_70.y = (float)local_88._4_4_ * fVar4;
    local_70.x = (float)local_88._0_4_ * fVar4;
    fVar5 = ndf(this,&local_70,&args);
    local_88._0_4_ = fVar5;
    fVar5 = sigma(this,wi,&args);
    local_88._0_4_ = (float)local_88._0_4_ / (fVar5 * 4.0);
  }
  return (float_t)local_88._0_4_;
}

Assistant:

float_t
microfacet::pdf(const vec3 &wi, const vec3 &wo, const void *user_args) const
{
	vec3 tmp = wi + wo;
	float_t nrm = dot(tmp, tmp);

	if (/*wi.z > 0 &&*/ nrm > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wh = tmp * inversesqrt(nrm);
		float_t D = ndf(wh, args);
		float_t s = sigma(wi, args);

		return (D / (4 * s));
	}

	return 0;
}